

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.h
# Opt level: O0

void __thiscall
flow::lang::CallExpr::CallExpr
          (CallExpr *this,SourceLocation *loc,CallableSym *callee,ParamList *args)

{
  ParamList *args_local;
  CallableSym *callee_local;
  SourceLocation *loc_local;
  CallExpr *this_local;
  
  Expr::Expr(&this->super_Expr,loc);
  (this->super_Expr).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__CallExpr_002c9a28;
  this->callee_ = callee;
  ParamList::ParamList(&this->args_,args);
  return;
}

Assistant:

CallExpr(const SourceLocation& loc, CallableSym* callee, ParamList&& args)
      : Expr(loc), callee_(callee), args_(std::move(args)) {}